

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O0

void __thiscall Diligent::BasicFile::BasicFile(BasicFile *this,FileOpenAttribs *OpenAttribs)

{
  Char *Path;
  undefined1 local_19;
  FileOpenAttribs *local_18;
  FileOpenAttribs *OpenAttribs_local;
  BasicFile *this_local;
  
  this->_vptr_BasicFile = (_func_int **)&PTR__BasicFile_00594c90;
  local_18 = OpenAttribs;
  OpenAttribs_local = (FileOpenAttribs *)this;
  BasicFile(Diligent::FileOpenAttribs_const&)::$_0::operator()[abi_cxx11_
            (&this->m_Path,&local_19,OpenAttribs->strFilePath);
  Path = (Char *)std::__cxx11::string::c_str();
  FileOpenAttribs::FileOpenAttribs(&this->m_OpenAttribs,Path,local_18->AccessMode);
  return;
}

Assistant:

BasicFile::BasicFile(const FileOpenAttribs& OpenAttribs) :
    m_Path //
    {
        [](const Char* strPath) //
        {
            String Path = strPath != nullptr ? strPath : "";
            BasicFileSystem::CorrectSlashes(Path);
            return Path;
        }(OpenAttribs.strFilePath) //
    },
    m_OpenAttribs{m_Path.c_str(), OpenAttribs.AccessMode}
{
}